

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

const_iterator * __thiscall
Catch::TextFlow::Column::const_iterator::operator++(const_iterator *this)

{
  Column *pCVar1;
  ulong uVar2;
  size_t sVar3;
  ulong uVar4;
  char *pcVar5;
  size_t sVar6;
  bool local_29;
  string *current_line;
  const_iterator *this_local;
  
  this->m_lineStart = this->m_lineLength + this->m_lineStart;
  pCVar1 = this->m_column;
  uVar2 = this->m_lineStart;
  uVar4 = std::__cxx11::string::size();
  if ((uVar2 < uVar4) &&
     (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pCVar1), *pcVar5 == '\n')) {
    this->m_lineStart = this->m_lineStart + 1;
  }
  else {
    while( true ) {
      uVar2 = this->m_lineStart;
      uVar4 = std::__cxx11::string::size();
      local_29 = false;
      if (uVar2 < uVar4) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)pCVar1);
        local_29 = anon_unknown.dwarf_b19f3::isWhitespace(*pcVar5);
      }
      if (local_29 == false) break;
      this->m_lineStart = this->m_lineStart + 1;
    }
  }
  sVar3 = this->m_lineStart;
  sVar6 = std::__cxx11::string::size();
  if (sVar3 != sVar6) {
    calcLength(this);
  }
  return this;
}

Assistant:

Column::const_iterator& Column::const_iterator::operator++() {
            m_lineStart += m_lineLength;
            std::string const& current_line = m_column.m_string;
            if ( m_lineStart < current_line.size() && current_line[m_lineStart] == '\n' ) {
                m_lineStart += 1;
            } else {
                while ( m_lineStart < current_line.size() &&
                        isWhitespace( current_line[m_lineStart] ) ) {
                    ++m_lineStart;
                }
            }

            if ( m_lineStart != current_line.size() ) {
                calcLength();
            }
            return *this;
        }